

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnStartFunction
          (BinaryReaderInterp *this,Index func_index)

{
  bool bVar1;
  value_type local_8c;
  Location local_88;
  Var local_68;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index func_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = func_index;
  pBStack_18 = this;
  Location::Location(&local_88);
  Var::Var(&local_68,func_index,&local_88);
  local_20 = (Enum)SharedValidator::OnStart
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_68);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_68);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_8c.func_index = local_1c;
    std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::push_back
              (&this->module_->starts,&local_8c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnStartFunction(Index func_index) {
  CHECK_RESULT(validator_.OnStart(loc, Var(func_index)));
  module_.starts.push_back(StartDesc{func_index});
  return Result::Ok;
}